

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O0

void anon_unknown.dwarf_11456c::pr_exit(pid_t pid,int status)

{
  char *d;
  int status_local;
  pid_t pid_local;
  
  pstore::log<int>(info,"GC process exited pid ",pid);
  if ((status & 0x7fU) == 0) {
    pstore::log<int>(info,"Normal termination, exit status = ",(int)(status & 0xff00U) >> 8);
  }
  else if ((char)(((byte)status & 0x7f) + 1) >> 1 < '\x01') {
    if ((status & 0xffU) == 0x7f) {
      pstore::log<int>(info,"Child stopped, signal number = ",(int)(status & 0xff00U) >> 8);
    }
  }
  else {
    pstore::log<int>(info,"Abormal termination, signal number ",status & 0x7f);
    d = core_dump_string(status);
    pstore::log<char_const*>(info,"  ",d);
  }
  return;
}

Assistant:

void pr_exit (pid_t const pid, int status) {
        log (priority::info, "GC process exited pid ", pid);
        if (WIFEXITED (status)) { //! OCLint(PH - OS-provided macro)
            log (priority::info, "Normal termination, exit status = ", WEXITSTATUS (status));
        } else if (WIFSIGNALED (status)) { //! OCLint(PH - OS-provided macro)
            log (priority::info, "Abormal termination, signal number ", WTERMSIG (status));
            log (priority::info, "  ", core_dump_string (status));
        } else if (WIFSTOPPED (status)) { //! OCLint(PH - OS-provided macro)
            log (priority::info, "Child stopped, signal number = ", WSTOPSIG (status));
        }
    }